

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int cvNlsFPFunction(N_Vector ycor,N_Vector res,void *cvode_mem)

{
  int iVar1;
  N_Vector in_RDX;
  undefined8 in_RSI;
  int retval;
  CVodeMem cv_mem;
  N_Vector in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  N_Vector a;
  int local_4;
  
  if (in_RDX == (N_Vector)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","cvNlsFPFunction","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    a = in_RDX;
    N_VLinearSum((realtype)in_RDX,in_RDX,
                 (realtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(N_Vector)0xefea81);
    iVar1 = (*(code *)in_RDX[0x29].content)
                      (in_RDX[0xf].content,in_RDX[8].sunctx,in_RSI,in_RDX[1].content);
    in_RDX[0x24].content = (void *)((long)in_RDX[0x24].content + 1);
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      N_VLinearSum((realtype)a,in_RDX,(realtype)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8,(N_Vector)0xefeb20);
      N_VScale((realtype)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (N_Vector)0xefeb3c);
      local_4 = 0;
    }
    else {
      local_4 = 10;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsFPFunction(N_Vector ycor, N_Vector res, void* cvode_mem)
{
 CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "cvNlsFPFunction", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* update the state based on the current correction */
  N_VLinearSum(ONE, cv_mem->cv_zn[0], ONE, ycor, cv_mem->cv_y);

  /* evaluate the rhs function */
  retval = cv_mem->nls_f(cv_mem->cv_tn, cv_mem->cv_y, res,
                         cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) return(CV_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  N_VLinearSum(cv_mem->cv_h, res, -ONE, cv_mem->cv_zn[1], res);
  N_VScale(cv_mem->cv_rl1, res, res);

  return(CV_SUCCESS);
}